

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_example.cpp
# Opt level: O0

void enumerate_examples(void)

{
  std::operator<<((ostream *)&std::cout,"enumerate examples\n");
  anon_unknown.dwarf_17d7::enumerate_example();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void enumerate_examples() {
  std::cout << "enumerate examples\n";

  enumerate_example();

  std::cout << std::endl;
}